

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

int imagetopgx(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  long lVar3;
  opj_image_comp_t *poVar4;
  char *__ptr;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  FILE *pFVar9;
  size_t sVar10;
  ulong extraout_RAX;
  char cVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  uchar byte;
  char bname [256];
  undefined1 local_199;
  opj_image_t *local_198;
  uint local_18c;
  ulong local_188;
  ulong local_180;
  opj_image_comp_t *local_178;
  FILE *local_170;
  char *local_168;
  long local_160;
  char *local_158;
  ulong local_150;
  ulong local_148;
  size_t local_140;
  char local_138 [264];
  
  if (image->numcomps == 0) {
    pFVar9 = (FILE *)0x0;
  }
  else {
    uVar20 = 0;
    pFVar9 = (FILE *)0x0;
    local_198 = image;
    local_158 = outfile;
    do {
      local_160 = uVar20 * 0x40;
      local_178 = image->comps + uVar20;
      sVar7 = strlen(outfile);
      if (outfile[sVar7 - 4] == '.') {
        local_188 = sVar7 - 0xff;
        pcVar8 = local_138;
        if ((local_188 < 0xfffffffffffffeff) &&
           (pcVar8 = (char *)malloc(sVar7 + 3), pcVar8 == (char *)0x0)) {
          imagetopgx_cold_3();
          goto LAB_0010855c;
        }
        strncpy(pcVar8,outfile,sVar7 - 4);
        sprintf(pcVar8 + (sVar7 - 4),"_%u.pgx",uVar20 & 0xffffffff);
        pFVar9 = fopen(pcVar8,"wb");
        poVar4 = local_178;
        if (pFVar9 == (FILE *)0x0) {
          fprintf(_stderr,"ERROR -> failed to open %s for writing\n",pcVar8);
          image = local_198;
          iVar18 = 5;
          if (local_188 < 0xfffffffffffffeff) {
            free(pcVar8);
          }
          pFVar9 = (FILE *)0x0;
        }
        else {
          uVar16 = *(uint *)((long)&local_198->comps->w + local_160);
          bVar21 = local_178->sgnd != 0;
          uVar17 = *(uint *)((long)&local_198->comps->h + local_160);
          local_170 = pFVar9;
          fprintf(pFVar9,"PG ML %c %d %d %d\n",(ulong)(bVar21 + 0x2b + (uint)bVar21),
                  (ulong)local_178->prec,(ulong)uVar16,(ulong)uVar17);
          iVar18 = (uint)(0x10 < poVar4->prec) * 2;
          local_168 = pcVar8;
          local_150 = uVar20;
          if (poVar4->prec < 9) {
            local_140 = (size_t)(int)uVar16;
            local_180 = (ulong)uVar17;
            pcVar8 = (char *)malloc(local_140);
            image = local_198;
            if (pcVar8 == (char *)0x0) {
              imagetopgx_cold_2();
              iVar18 = 5;
              bVar21 = false;
              pcVar8 = local_168;
              bVar5 = false;
              if ((extraout_RAX & 1) != 0) goto LAB_0010849e;
            }
            else {
              iVar18 = 0;
              bVar5 = true;
              if (0 < (int)local_180) {
                uVar20 = (ulong)uVar16;
                local_148 = uVar20 * 4;
                lVar12 = 0;
                uVar19 = 0;
                local_18c = uVar16;
                do {
                  sVar7 = local_140;
                  OVar1 = local_178->prec;
                  if ((OVar1 == 8) && (local_178->sgnd == 0)) {
                    if (0 < (int)local_18c) {
                      lVar3 = *(long *)((long)&local_198->comps->data + local_160);
                      uVar13 = 0;
                      do {
                        iVar14 = *(int *)(lVar3 + lVar12 + uVar13 * 4);
                        if (0xfe < iVar14) {
                          iVar14 = 0xff;
                        }
                        cVar11 = (char)iVar14;
                        if (iVar14 < 1) {
                          cVar11 = '\0';
                        }
                        pcVar8[uVar13] = cVar11;
                        uVar13 = uVar13 + 1;
                      } while (uVar20 != uVar13);
                    }
                  }
                  else if (0 < (int)local_18c) {
                    OVar2 = local_178->sgnd;
                    lVar3 = *(long *)((long)&local_198->comps->data + local_160);
                    uVar13 = 0;
                    do {
                      iVar14 = *(int *)(lVar3 + lVar12 + uVar13 * 4);
                      if (OVar2 == 0) {
                        if ((int)OVar1 < 9) {
                          if (0xfe < iVar14) {
                            iVar14 = 0xff;
                          }
                        }
                        else {
                          if (0x10 < (int)OVar1) goto LAB_00108290;
                          if (0xfffe < iVar14) {
                            iVar14 = 0xffff;
                          }
                        }
                        if (iVar14 < 1) {
                          iVar14 = 0;
                        }
                      }
                      else {
                        if ((int)OVar1 < 9) {
                          if (0x7e < iVar14) {
                            iVar14 = 0x7f;
                          }
                          bVar21 = SBORROW4(iVar14,-0x7f);
                          iVar6 = iVar14 + 0x7f;
                          iVar15 = -0x80;
                        }
                        else {
                          if (0x10 < (int)OVar1) goto LAB_00108290;
                          if (0x7ffe < iVar14) {
                            iVar14 = 0x7fff;
                          }
                          bVar21 = SBORROW4(iVar14,-0x7fff);
                          iVar6 = iVar14 + 0x7fff;
                          iVar15 = 0;
                        }
                        if (bVar21 != iVar6 < 0) {
                          iVar14 = iVar15;
                        }
                      }
LAB_00108290:
                      pcVar8[uVar13] = (char)iVar14;
                      uVar13 = uVar13 + 1;
                    } while (uVar20 != uVar13);
                  }
                  sVar10 = fwrite(pcVar8,1,local_140,local_170);
                  __ptr = local_168;
                  if (sVar10 != sVar7) {
                    fprintf(_stderr,"failed to write %d bytes for %s\n",(ulong)local_18c,local_168);
                    iVar18 = 5;
                    image = local_198;
                    bVar5 = false;
                    if (local_188 < 0xfffffffffffffeff) {
                      free(__ptr);
                      image = local_198;
                      bVar5 = false;
                    }
                    goto LAB_0010849e;
                  }
                  uVar19 = uVar19 + 1;
                  lVar12 = lVar12 + local_148;
                } while (uVar19 != local_180);
                image = local_198;
                bVar5 = true;
              }
LAB_0010849e:
              bVar21 = bVar5;
              free(pcVar8);
            }
            pFVar9 = local_170;
            outfile = local_158;
            uVar20 = local_150;
            if (!bVar21) goto LAB_001084f6;
          }
          else {
            image = local_198;
            if (0 < (int)(uVar16 * uVar17)) {
              local_148 = (ulong)(uVar16 * uVar17);
              local_18c = iVar18 + 2;
              local_140 = (size_t)(uint)((iVar18 + 1) * 8);
              uVar19 = 0;
              do {
                iVar14 = *(int *)(*(long *)((long)&local_198->comps->data + local_160) + uVar19 * 4)
                ;
                OVar1 = local_178->prec;
                if (local_178->sgnd == 0) {
                  if ((int)OVar1 < 9) {
                    if (0xfe < iVar14) {
                      iVar14 = 0xff;
                    }
                  }
                  else {
                    if (0x10 < (int)OVar1) goto LAB_001083db;
                    if (0xfffe < iVar14) {
                      iVar14 = 0xffff;
                    }
                  }
                  if (iVar14 < 1) {
                    iVar14 = 0;
                  }
                }
                else {
                  if ((int)OVar1 < 9) {
                    if (0x7e < iVar14) {
                      iVar14 = 0x7f;
                    }
                    bVar21 = SBORROW4(iVar14,-0x7f);
                    iVar18 = iVar14 + 0x7f;
                    iVar6 = -0x80;
                  }
                  else {
                    if (0x10 < (int)OVar1) goto LAB_001083db;
                    if (0x7ffe < iVar14) {
                      iVar14 = 0x7fff;
                    }
                    bVar21 = SBORROW4(iVar14,-0x7fff);
                    iVar18 = iVar14 + 0x7fff;
                    iVar6 = -0x8000;
                  }
                  if (bVar21 != iVar18 < 0) {
                    iVar14 = iVar6;
                  }
                }
LAB_001083db:
                uVar20 = local_140 & 0xffffffff;
                uVar16 = local_18c;
                do {
                  local_199 = (undefined1)(iVar14 >> ((byte)uVar20 & 0x1f));
                  sVar7 = fwrite(&local_199,1,1,local_170);
                  pcVar8 = local_168;
                  iVar18 = 0;
                  if (sVar7 == 0) {
                    local_180 = uVar19;
                    fprintf(_stderr,"failed to write 1 byte for %s\n",local_168);
                    iVar18 = 5;
                    uVar19 = local_180;
                    if (local_188 < 0xfffffffffffffeff) {
                      free(pcVar8);
                      uVar19 = local_180;
                    }
                  }
                  if (sVar7 == 0) goto LAB_0010846d;
                  uVar20 = (ulong)((int)uVar20 - 8);
                  uVar17 = uVar16 - 1;
                  bVar21 = 0 < (int)uVar16;
                  uVar16 = uVar17;
                } while (uVar17 != 0 && bVar21);
                iVar18 = 0;
LAB_0010846d:
                image = local_198;
                pFVar9 = local_170;
                outfile = local_158;
                uVar20 = local_150;
                if (iVar18 != 0) goto LAB_001084f6;
                uVar19 = uVar19 + 1;
              } while (uVar19 != local_148);
            }
          }
          if (local_188 < 0xfffffffffffffeff) {
            free(local_168);
          }
          fclose(local_170);
          iVar18 = 0;
          pFVar9 = (FILE *)0x0;
          outfile = local_158;
          uVar20 = local_150;
        }
      }
      else {
        imagetopgx_cold_1();
LAB_0010855c:
        iVar18 = 5;
        image = local_198;
      }
LAB_001084f6:
      if (iVar18 != 0) {
        iVar14 = 1;
        if (iVar18 != 5) {
          return 1;
        }
        goto LAB_001085f5;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < image->numcomps);
  }
  iVar14 = 0;
LAB_001085f5:
  if (pFVar9 != (FILE *)0x0) {
    fclose(pFVar9);
  }
  return iVar14;
}

Assistant:

int imagetopgx(opj_image_t * image, const char *outfile)
{
    int w, h;
    int i, j, fails = 1;
    unsigned int compno;
    FILE *fdest = NULL;

    for (compno = 0; compno < image->numcomps; compno++) {
        opj_image_comp_t *comp = &image->comps[compno];
        char bname[256]; /* buffer for name */
        char *name = bname; /* pointer */
        int nbytes = 0;
        size_t res;
        const size_t olen = strlen(outfile);
        const size_t dotpos = olen - 4;
        const size_t total = dotpos + 1 + 1 + 4; /* '-' + '[1-3]' + '.pgx' */

        if (outfile[dotpos] != '.') {
            /* `pgx` was recognized but there is no dot at expected position */
            fprintf(stderr, "ERROR -> Impossible happen.");
            goto fin;
        }
        if (total > 256) {
            name = (char*)malloc(total + 1);
            if (name == NULL) {
                fprintf(stderr, "imagetopgx: memory out\n");
                goto fin;
            }
        }
        strncpy(name, outfile, dotpos);
        sprintf(name + dotpos, "_%u.pgx", compno);
        fdest = fopen(name, "wb");
        /* don't need name anymore */

        if (!fdest) {

            fprintf(stderr, "ERROR -> failed to open %s for writing\n", name);
            if (total > 256) {
                free(name);
            }
            goto fin;
        }

        w = (int)image->comps[compno].w;
        h = (int)image->comps[compno].h;

        fprintf(fdest, "PG ML %c %d %d %d\n", comp->sgnd ? '-' : '+', comp->prec,
                w, h);

        if (comp->prec <= 8) {
            nbytes = 1;
        } else if (comp->prec <= 16) {
            nbytes = 2;
        } else {
            nbytes = 4;
        }

        if (nbytes == 1) {
            unsigned char* line_buffer = malloc((size_t)w);
            if (line_buffer == NULL) {
                fprintf(stderr, "Out of memory");
                if (total > 256) {
                    free(name);
                }
                goto fin;
            }
            for (j = 0; j < h; j++) {
                if (comp->prec == 8 && comp->sgnd == 0) {
                    for (i = 0; i < w; i++) {
                        line_buffer[i] = (unsigned char)CLAMP(image->comps[compno].data[j * w + i], 0,
                                                              255);
                    }
                } else {
                    for (i = 0; i < w; i++) {
                        line_buffer[i] = (unsigned char)
                                         clamp(image->comps[compno].data[j * w + i],
                                               (int)comp->prec, (int)comp->sgnd);
                    }
                }
                res = fwrite(line_buffer, 1, (size_t)w, fdest);
                if (res != (size_t)w) {
                    fprintf(stderr, "failed to write %d bytes for %s\n", w, name);
                    if (total > 256) {
                        free(name);
                    }
                    free(line_buffer);
                    goto fin;
                }
            }
            free(line_buffer);
        } else {

            for (i = 0; i < w * h; i++) {
                /* FIXME: clamp func is being called within a loop */
                const int val = clamp(image->comps[compno].data[i],
                                      (int)comp->prec, (int)comp->sgnd);

                for (j = nbytes - 1; j >= 0; j--) {
                    int v = (int)(val >> (j * 8));
                    unsigned char byte = (unsigned char)v;
                    res = fwrite(&byte, 1, 1, fdest);

                    if (res < 1) {
                        fprintf(stderr, "failed to write 1 byte for %s\n", name);
                        if (total > 256) {
                            free(name);
                        }
                        goto fin;
                    }
                }
            }
        }

        if (total > 256) {
            free(name);
        }
        fclose(fdest);
        fdest = NULL;
    }
    fails = 0;
fin:
    if (fdest) {
        fclose(fdest);
    }

    return fails;
}